

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_vexp.c
# Opt level: O0

ex_ex * eval_store(expr *expr,ex_ex *eptr,ex_ex *optr,int idx)

{
  long lVar1;
  t_symbol *var_00;
  int iVar2;
  ex_ex *eptr_00;
  int notable;
  int badleft;
  char *var;
  char *tbl;
  ex_ex *retp;
  ex_ex rval;
  anon_union_8_5_735de1bb_for_ex_cont aStack_48;
  ex_ex arg;
  int idx_local;
  ex_ex *optr_local;
  ex_ex *eptr_local;
  expr *expr_local;
  
  arg.ex_type = 0;
  retp = (ex_ex *)0x0;
  rval.ex_cont.v_int = 0;
  rval.ex_type = 0;
  arg.ex_cont.v_int = 1;
  aStack_48.v_int = 0;
  lVar1 = eptr->ex_type;
  arg.ex_end._4_4_ = idx;
  if (lVar1 == 5) {
    var = (eptr->ex_cont).ptr;
  }
  else {
    if (lVar1 != 0xd) {
      if (lVar1 == 0x15) {
        var_00 = (t_symbol *)(eptr->ex_cont).v_vec;
        tbl = (char *)ex_eval(expr,eptr + 1,(ex_ex *)&aStack_48,idx);
        iVar2 = max_ex_var_store(expr,var_00,(ex_ex *)&aStack_48,optr);
        if (iVar2 != 0) {
          tbl = (char *)0x0;
        }
        if (arg.ex_cont.v_int == 0xf) {
          free(aStack_48.v_vec);
        }
        return (ex_ex *)tbl;
      }
      post("Bad left value: ");
      ex_print(eptr);
      return (ex_ex *)0x0;
    }
    if (expr->exp_var[(eptr->ex_cont).v_int].ex_cont.v_int == 0) {
      if ((expr->exp_error & 8U) == 0) {
        post("expr: syntax error: no string for inlet %d",(eptr->ex_cont).v_int + 1);
        post("expr: No more table errors will be reported");
        post("expr: till the next reset");
        expr->exp_error = expr->exp_error | 8;
      }
      post("Bad left value: ");
      ex_print(eptr);
      return (ex_ex *)0x0;
    }
    var = expr->exp_var[(eptr->ex_cont).v_int].ex_cont.ptr;
  }
  arg.ex_cont.v_int = 0;
  aStack_48.v_int = 0;
  eptr_00 = ex_eval(expr,eptr + 1,(ex_ex *)&aStack_48,idx);
  if (eptr_00 == (ex_ex *)0x0) {
    expr_local = (expr *)0x0;
  }
  else {
    expr_local = (expr *)ex_eval(expr,eptr_00,(ex_ex *)&retp,arg.ex_end._4_4_);
    if (expr_local != (expr *)0x0) {
      optr->ex_type = 1;
      (optr->ex_cont).v_int = 0;
      max_ex_tab_store(expr,(t_symbol *)var,(ex_ex *)&aStack_48,(ex_ex *)&retp,optr);
      if (arg.ex_cont.v_int == 0xf) {
        free(aStack_48.v_vec);
      }
    }
  }
  return (ex_ex *)expr_local;
}

Assistant:

struct ex_ex *
eval_store(struct expr *expr, struct ex_ex *eptr, struct ex_ex *optr, int idx)
/* the expr object data pointer */
/* the operation stack */
/* the result pointer */
{
        struct ex_ex arg = { 0 };
        struct ex_ex rval = { 0 };
        struct ex_ex *retp;
        char *tbl = (char *) 0;
        char *var = (char *) 0;
        int badleft = 0;
        int notable = 0;

        arg.ex_type = ET_INT;
        arg.ex_int = 0;

        switch (eptr->ex_type) {
        case ET_VAR:
                var = (char *) eptr->ex_ptr;
                eptr = ex_eval(expr, ++eptr, &arg, idx);
                if (max_ex_var_store(expr, (t_symbol *)var, &arg, optr))
                        retp = exNULL;
                else
                        retp = eptr;

                if (arg.ex_type == ET_VEC)
                        fts_free(arg.ex_vec);
                return(retp);
        case ET_TBL:
                tbl = (char *) eptr->ex_ptr;
                break;
        case ET_SI:
                if (!expr->exp_var[eptr->ex_int].ex_ptr) {
                        if (!(expr->exp_error & EE_NOTABLE)) {
                                post("expr: syntax error: no string for inlet %d",
                                                                                                                eptr->ex_int + 1);
                                post("expr: No more table errors will be reported");
                                post("expr: till the next reset");
                                expr->exp_error |= EE_NOTABLE;
                        }
                        badleft++;
                        post("Bad left value: ");
                        /* report Error */
                        ex_print(eptr);
                        retp = exNULL;
                        return (retp);
                } else {
                        tbl = (char *) expr->exp_var[eptr->ex_int].ex_ptr;
                }
                break;
        default:
                post("Bad left value: ");
                /* report Error */
                ex_print(eptr);
                retp = exNULL;
                return (retp);
        }
        arg.ex_type = 0;
        arg.ex_int = 0;
        /* evaluate the index of the table */
        if (!(eptr = ex_eval(expr, ++eptr, &arg, idx)))
                return (eptr);

        /* evaluate the right index of the table */
        if (!(eptr = ex_eval(expr, eptr, &rval, idx)))
                return (eptr);
        optr->ex_type = ET_INT;
        optr->ex_int = 0;
        if (!notable || badleft)
                (void)max_ex_tab_store(expr, (t_symbol *)tbl, &arg, &rval, optr);
        if (arg.ex_type == ET_VEC)
                fts_free(arg.ex_vec);
        return (eptr);
}